

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::GetElementIHelper
              (Var instance,Var index,Var receiver,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  IndexType IVar3;
  int iVar4;
  BOOL BVar5;
  Var indexVar;
  undefined4 *puVar6;
  JavascriptString *propertyString;
  RecyclableObject *pRVar7;
  undefined1 local_98 [8];
  PropertyValueInfo info;
  JavascriptString *propertyNameString;
  PropertyRecord *propertyRecord;
  RecyclableObject *pRStack_40;
  uint32 indexVal;
  RecyclableObject *object;
  Var value;
  
  pRStack_40 = (RecyclableObject *)0x0;
  bVar2 = GetPropertyObjectForElementAccess
                    (instance,index,scriptContext,&stack0xffffffffffffffc0,
                     JSERR_Property_CannotGet_NullOrUndefined);
  if (!bVar2) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  propertyNameString = (JavascriptString *)0x0;
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  object = (RecyclableObject *)0x0;
  indexVar = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)1>(index,scriptContext);
  IVar3 = GetIndexTypeFromPrimitive
                    (indexVar,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                     (PropertyRecord **)&propertyNameString,
                     (JavascriptString **)&info.inlineCacheIndex,false,true);
  if (IVar3 == IndexType_JavascriptString) {
    local_98 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    iVar4 = GetPropertyWPCache<false,Js::JavascriptString*>
                      (receiver,pRStack_40,(JavascriptString *)info._56_8_,&object,scriptContext,
                       (PropertyValueInfo *)local_98);
  }
  else if (IVar3 == IndexType_Number) {
    iVar4 = GetItem(receiver,pRStack_40,propertyRecord._4_4_,&object,scriptContext);
  }
  else {
    if ((propertyNameString == (JavascriptString *)0x0) &&
       (bVar2 = CanShortcutOnUnknownPropertyName(pRStack_40), !bVar2)) {
      IVar3 = GetIndexTypeFromPrimitive
                        (indexVar,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                         (PropertyRecord **)&propertyNameString,
                         (JavascriptString **)&info.inlineCacheIndex,true,true);
      if (IVar3 != IndexType_PropertyId) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x107b,"(indexType == IndexType_PropertyId)",
                                    "indexType == IndexType_PropertyId");
        if (!bVar2) goto LAB_00abc301;
        *puVar6 = 0;
      }
      if (propertyNameString == (JavascriptString *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x107c,"(propertyRecord != nullptr)",
                                    "propertyRecord != nullptr");
        if (!bVar2) goto LAB_00abc301;
        *puVar6 = 0;
      }
    }
    if (propertyNameString == (JavascriptString *)0x0) {
      propertyString = JavascriptConversion::ToString(indexVar,scriptContext);
      ScriptContext::GetOrAddPropertyRecord
                (scriptContext,propertyString,(PropertyRecord **)local_98);
      BVar5 = GetProperty_Internal<false>
                        (receiver,pRStack_40,false,
                         *(PropertyId *)&((Type *)((long)local_98 + 8))->ptr,&object,scriptContext,
                         (PropertyValueInfo *)0x0);
      if (BVar5 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x108d,
                                    "(!JavascriptOperators::GetProperty(receiver, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext))"
                                    ,
                                    "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                   );
        if (!bVar2) {
LAB_00abc301:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      goto LAB_00abc2ea;
    }
    local_98 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    iVar4 = GetPropertyWPCache<false,int>
                      (receiver,pRStack_40,
                       *(int *)&(propertyNameString->super_RecyclableObject).type.ptr,&object,
                       scriptContext,(PropertyValueInfo *)local_98);
  }
  if (iVar4 != 0) {
    return object;
  }
LAB_00abc2ea:
  pRVar7 = ScriptContext::GetMissingItemResult(scriptContext);
  return pRVar7;
}

Assistant:

Var JavascriptOperators::GetElementIHelper(Var instance, Var index, Var receiver, ScriptContext* scriptContext)
    {
        RecyclableObject* object = nullptr;
        if (!JavascriptOperators::GetPropertyObjectForGetElementI(instance, index, scriptContext, &object))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptString * propertyNameString = nullptr;
        Var value = nullptr;

        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, false, true);

        if (indexType == IndexType_Number)
        {
            if (JavascriptOperators::GetItem(receiver, object, indexVal, &value, scriptContext))
            {
                return value;
            }
        }
        else if (indexType == IndexType_JavascriptString)
        {
            PropertyValueInfo info;
            if (JavascriptOperators::GetPropertyWPCache<false /* OutputExistence */>(receiver, object, propertyNameString, &value, scriptContext, &info))
            {
                return value;
            }
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);
            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, true, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                PropertyValueInfo info;
                if (JavascriptOperators::GetPropertyWPCache<false /* OutputExistence */>(receiver, object, propertyRecord->GetPropertyId(), &value, scriptContext, &info))
                {
                    return value;
                }
            }
#if DBG
            else
            {
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(!JavascriptOperators::GetProperty(receiver, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext), "how did this property come? See OS Bug 2727708 if you see this come from the web");
            }
#endif
        }

        return scriptContext->GetMissingItemResult();
    }